

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::runTo(Recorder *this,Time runToTime)

{
  format_string<std::__cxx11::basic_string<char>_&,_int_&,_double,_std::__cxx11::basic_string<char>_&>
  fmt;
  format_string<std::__cxx11::basic_string<char>_&,_int_&,_double,_std::__cxx11::basic_string<char>_&>
  fmt_00;
  Modes MVar1;
  bool bVar2;
  reference pVVar3;
  TimeRepresentation<count_time<9,_long>_> args_3;
  ostream *this_00;
  ostream *in_RSI;
  long *in_RDI;
  double dVar4;
  iteration_time iVar5;
  ValueStats *stat_1;
  iterator __end4;
  iterator __begin4;
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
  *__range4;
  ofstream out_1;
  iteration_time ItRes;
  Time grantedTime;
  int iteration;
  Time nextPrintTime;
  ValueStats *stat;
  iterator __end3;
  iterator __begin3;
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
  *__range3;
  ofstream out;
  string *in_stack_fffffffffffffab8;
  ostream *in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffb20;
  Federate *in_stack_fffffffffffffb28;
  iterator in_stack_fffffffffffffb30;
  __normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
  local_4c8;
  Federate *in_stack_fffffffffffffb40;
  Time in_stack_fffffffffffffb48;
  double *in_stack_fffffffffffffd38;
  int *in_stack_fffffffffffffd40;
  Time in_stack_fffffffffffffd48;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffffd50;
  Time in_stack_fffffffffffffd58;
  Time in_stack_fffffffffffffd60;
  TimeRepresentation<count_time<9,_long>_> local_270;
  int local_264;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffffda0;
  __normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
  local_220;
  long *local_218;
  undefined1 local_210 [28];
  int in_stack_fffffffffffffe0c;
  Recorder *in_stack_fffffffffffffe10;
  Time in_stack_fffffffffffffe18;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = (baseType)in_RSI;
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x212efd);
  MVar1 = Federate::getCurrentMode((Federate *)0x212f0c);
  if (MVar1 == STARTUP) {
    (**(code **)(*in_RDI + 0x10))();
  }
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x212f2c);
  if (!bVar2) {
    std::ofstream::ofstream(local_210,(string *)(in_RDI + 0x53),_S_out);
    local_218 = in_RDI + 0x4d;
    local_220._M_current =
         (ValueStats *)
         CLI::std::
         vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
         ::begin((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                  *)in_stack_fffffffffffffab8);
    CLI::std::
    vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
    ::end((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
           *)in_stack_fffffffffffffab8);
    while (bVar2 = __gnu_cxx::
                   operator==<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
                             ((__normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
                               *)in_stack_fffffffffffffac0,
                              (__normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
                               *)in_stack_fffffffffffffab8), ((bVar2 ^ 0xffU) & 1) != 0) {
      pVVar3 = __gnu_cxx::
               __normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
               ::operator*(&local_220);
      TimeRepresentation::operator_cast_to_double
                ((TimeRepresentation<count_time<9,_long>_> *)0x213004);
      in_stack_fffffffffffffab8 = &pVVar3->lastVal;
      fmt.str.size_ = in_stack_fffffffffffffd60.internalTimeCode;
      fmt.str.data_ = (char *)in_stack_fffffffffffffd58.internalTimeCode;
      ::fmt::v11::print<std::__cxx11::string&,int&,double,std::__cxx11::string&>
                ((ostream *)in_stack_fffffffffffffd50.internalTimeCode,fmt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd48.internalTimeCode,in_stack_fffffffffffffd40,
                 in_stack_fffffffffffffd38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffda0.internalTimeCode);
      __gnu_cxx::
      __normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
      ::operator++(&local_220);
    }
    std::ostream::flush();
    std::ofstream::~ofstream(local_210);
  }
  bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x15),
                     (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if (bVar2) {
    args_3.internalTimeCode = in_RDI[0x15];
  }
  else {
    args_3 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  }
  local_264 = 0;
  while( true ) {
    if ((*(byte *)(in_RDI + 0x14) & 1) == 0) {
      CLI::std::
      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x213213);
      in_stack_fffffffffffffd50.internalTimeCode = local_8.internalTimeCode;
      in_stack_fffffffffffffd48 =
           Federate::requestTime(in_stack_fffffffffffffb40,in_stack_fffffffffffffb48);
      in_stack_fffffffffffffd58 = in_stack_fffffffffffffd48;
      local_270.internalTimeCode = in_stack_fffffffffffffd48.internalTimeCode;
      captureForCurrentTime
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe0c);
    }
    else {
      CLI::std::
      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x213114);
      iVar5 = Federate::requestTimeIterative
                        (in_stack_fffffffffffffb28,(Time)in_stack_fffffffffffffb30._M_current,
                         (IterationRequest)((ulong)in_stack_fffffffffffffb20 >> 0x38));
      in_stack_fffffffffffffd60 = iVar5.grantedTime.internalTimeCode;
      if (iVar5.state == NEXT_STEP) {
        local_264 = 0;
      }
      local_270.internalTimeCode = in_stack_fffffffffffffd60.internalTimeCode;
      captureForCurrentTime
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe0c);
      local_264 = local_264 + 1;
    }
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x21329a);
    if (!bVar2) {
      std::ofstream::ofstream(&stack0xfffffffffffffb48,(string *)(in_RDI + 0x53),_S_out);
      in_stack_fffffffffffffb40 = (Federate *)(in_RDI + 0x4d);
      local_4c8._M_current =
           (ValueStats *)
           CLI::std::
           vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
           ::begin((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                    *)in_stack_fffffffffffffab8);
      in_stack_fffffffffffffb30 =
           CLI::std::
           vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
           ::end((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                  *)in_stack_fffffffffffffab8);
      while (bVar2 = __gnu_cxx::
                     operator==<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
                               ((__normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
                                 *)in_stack_fffffffffffffac0,
                                (__normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
                                 *)in_stack_fffffffffffffab8), ((bVar2 ^ 0xffU) & 1) != 0) {
        in_stack_fffffffffffffb28 =
             (Federate *)
             __gnu_cxx::
             __normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
             ::operator*(&local_4c8);
        in_stack_fffffffffffffb20 = 0;
        TimeRepresentation::operator_cast_to_double
                  ((TimeRepresentation<count_time<9,_long>_> *)0x213362);
        in_stack_fffffffffffffab8 = (string *)&in_stack_fffffffffffffb28->currentMode;
        fmt_00.str.size_ = in_stack_fffffffffffffd60.internalTimeCode;
        fmt_00.str.data_ = (char *)in_stack_fffffffffffffd58.internalTimeCode;
        ::fmt::v11::print<std::__cxx11::string&,int&,double,std::__cxx11::string&>
                  ((ostream *)in_stack_fffffffffffffd50.internalTimeCode,fmt_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd48.internalTimeCode,in_stack_fffffffffffffd40,
                   in_stack_fffffffffffffd38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   args_3.internalTimeCode);
        __gnu_cxx::
        __normal_iterator<helics::apps::Recorder::ValueStats_*,_std::vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>_>
        ::operator++(&local_4c8);
      }
      std::ostream::flush();
      std::ofstream::~ofstream(&stack0xfffffffffffffb48);
    }
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>=(&local_270,&local_8);
    if (bVar2) break;
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>=
                      (&local_270,
                       (TimeRepresentation<count_time<9,_long>_> *)&stack0xfffffffffffffda0);
    if ((bVar2) &&
       (bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                          ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x15),
                           (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero), bVar2)) {
      this_00 = std::operator<<((ostream *)&std::cout,"processed for time ");
      dVar4 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x2134a2);
      in_stack_fffffffffffffac0 = (ostream *)std::ostream::operator<<(this_00,dVar4);
      std::operator<<(in_stack_fffffffffffffac0,"\n");
      TimeRepresentation<count_time<9,_long>_>::operator+=
                ((TimeRepresentation<count_time<9,_long>_> *)&stack0xfffffffffffffda0,
                 (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x15));
    }
  }
  return;
}

Assistant:

void Recorder::runTo(Time runToTime)
{
    if (fed->getCurrentMode() == Federate::Modes::STARTUP) {
        initialize();
    }

    if (!mapfile.empty()) {
        std::ofstream out(mapfile);
        for (auto& stat : vStat) {
            //    out << stat.key << "\t" << stat.cnt << '\t' << static_cast<double> (stat.time)
            //    << '\t' << stat.lastVal
            //        << '\n';
            fmt::print(out,
                       "{}\t{}\t{}\t{}\n",
                       stat.key,
                       stat.cnt,
                       static_cast<double>(stat.time),
                       stat.lastVal);
        }
        out.flush();
    }
    Time nextPrintTime = (nextPrintTimeStep > timeZero) ? nextPrintTimeStep : Time::maxVal();
    try {
        int iteration = 0;
        while (true) {
            helics::Time grantedTime;
            if (allow_iteration) {
                auto ItRes =
                    fed->requestTimeIterative(runToTime, IterationRequest::ITERATE_IF_NEEDED);
                if (ItRes.state == IterationResult::NEXT_STEP) {
                    iteration = 0;
                }
                grantedTime = ItRes.grantedTime;
                captureForCurrentTime(grantedTime, iteration);
                ++iteration;
            } else {
                grantedTime = fed->requestTime(runToTime);
                captureForCurrentTime(grantedTime);
            }
            if (!mapfile.empty()) {
                std::ofstream out(mapfile);
                for (auto& stat : vStat) {
                    fmt::print(out,
                               "{}\t{}\t{}\t{}\n",
                               stat.key,
                               stat.cnt,
                               static_cast<double>(stat.time),
                               stat.lastVal);
                }
                out.flush();
            }
            if (grantedTime >= runToTime) {
                break;
            }
            if ((grantedTime >= nextPrintTime) && (nextPrintTimeStep > timeZero)) {
                std::cout << "processed for time " << static_cast<double>(grantedTime) << "\n";
                nextPrintTime += nextPrintTimeStep;
            }
        }
    }
    catch (...) {
        std::cerr << "error generate on run\n";
    }
}